

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

void refreshMultiLine(linenoiseState *l,int flags)

{
  char *__s;
  bool bVar1;
  int iVar2;
  size_t plen;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  string ab;
  char seq [64];
  string local_a8;
  int local_84;
  size_t local_80;
  undefined8 local_78;
  undefined2 local_70;
  
  __s = l->prompt;
  plen = strlen(__s);
  sVar3 = promptTextColumnLen(__s,plen);
  sVar4 = columnPosForMultiLine(l->buf,l->len,l->len,l->cols,sVar3);
  uVar6 = l->cols;
  iVar7 = (int)l->oldrows;
  local_84 = l->ofd;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  iVar2 = (int)((((long)(int)sVar4 + uVar6 + sVar3) - 1) / uVar6);
  l->oldrows = (long)iVar2;
  local_80 = sVar3;
  if ((flags & 1U) != 0) {
    if ((int)((uVar6 + sVar3 + l->oldcolpos) / uVar6) < iVar7) {
      snprintf((char *)&local_78,0x40,"\x1b[%dB");
      std::__cxx11::string::append((char *)&local_a8);
    }
    if (1 < iVar7) {
      iVar7 = iVar7 + -1;
      do {
        local_78 = 0x315b1b4b305b1b0d;
        local_70 = 0x41;
        std::__cxx11::string::append((char *)&local_a8);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
  }
  sVar3 = local_80;
  if ((flags & 3U) != 0) {
    local_78 = CONCAT26(local_78._6_2_,0x4b00000000);
    local_78 = CONCAT44(local_78._4_4_,0x305b1b0d);
    std::__cxx11::string::append((char *)&local_a8);
  }
  sVar4 = columnPosForMultiLine(l->buf,l->len,l->pos,l->cols,sVar3);
  iVar7 = (int)sVar4;
  if ((flags & 2U) != 0) {
    std::__cxx11::string::append((char *)&local_a8);
    if (maskmode == '\x01') {
      if (l->len != 0) {
        uVar6 = 1;
        do {
          std::__cxx11::string::append((char *)&local_a8);
          bVar1 = uVar6 < l->len;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar1);
      }
    }
    else {
      std::__cxx11::string::append((char *)&local_a8,(ulong)l->buf);
    }
    refreshShowHints(&local_a8,l,(int)sVar3);
    if (((l->pos != 0) && (l->pos == l->len)) && (((long)iVar7 + sVar3) % l->cols == 0)) {
      std::__cxx11::string::append((char *)&local_a8);
      local_78 = CONCAT62(local_78._2_6_,0xd);
      std::__cxx11::string::append((char *)&local_a8);
      iVar5 = iVar2 + 1;
      bVar1 = (int)l->oldrows <= iVar2;
      iVar2 = iVar5;
      if (bVar1) {
        l->oldrows = (long)iVar5;
      }
    }
    uVar6 = l->cols;
    if ((int)((uVar6 + sVar3 + (long)iVar7) / uVar6) < iVar2) {
      snprintf((char *)&local_78,0x40,"\x1b[%dA");
      std::__cxx11::string::append((char *)&local_a8);
      uVar6 = l->cols;
    }
    if ((int)((sVar3 + (long)iVar7) % uVar6) == 0) {
      local_78 = CONCAT62(local_78._2_6_,0xd);
    }
    else {
      snprintf((char *)&local_78,0x40,"\r\x1b[%dC");
    }
    std::__cxx11::string::append((char *)&local_a8);
  }
  l->oldcolpos = (long)iVar7;
  write(local_84,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

static void refreshMultiLine(struct linenoiseState *l, int flags) {
    char seq[64];
    size_t      pcollen = promptTextColumnLen(l->prompt, strlen(l->prompt));
    int         colpos  = columnPosForMultiLine(l->buf, l->len, l->len, l->cols, pcollen);
    int         colpos2;                                             /* cursor column position. */
    int         rows = (pcollen + colpos + l->cols - 1) / l->cols;   /* rows used by current buf. */
    int         rpos = (pcollen + l->oldcolpos + l->cols) / l->cols; /* cursor relative row. */
    int rpos2; /* rpos after refresh. */
    int         col;   /* column position, zero-based. */
    int old_rows = l->oldrows;
    int fd = l->ofd, j;
    std::string ab;
    l->oldrows = rows;

    /* First step: clear all the lines used before. To do so start by
     * going to the last row. */
    if (flags & REFRESH_CLEAN) {
        if (old_rows - rpos > 0) {
            snprintf(seq,64,"\x1b[%dB", old_rows-rpos);
            ab.append(seq);
        }

        /* Now for every row clear it, go up. */
        for (j = 0; j < old_rows - 1; j++) {
            snprintf(seq,64,"\r\x1b[0K\x1b[1A");
            ab.append(seq);
        }
    }

    if (flags & REFRESH_ALL) {
        /* Clean the top line. */
        snprintf(seq,64,"\r\x1b[0K");
        ab.append(seq);
    }

    /* Get column length to cursor position */
    colpos2 = columnPosForMultiLine(l->buf, l->len, l->pos, l->cols, pcollen);

    if (flags & REFRESH_WRITE) {
        /* Write the prompt and the current buffer content */
        ab.append(l->prompt);
        if (maskmode == 1) {
            for (unsigned int i = 0; i < l->len; ++i) {
                ab.append("*");
            }
        } else {
            ab.append(l->buf, l->len);
        }

        /* Show hits if any. */
        refreshShowHints(ab, l, pcollen);

        /* If we are at the very end of the screen with our prompt, we need to
         * emit a newline and move the prompt to the first column. */
        if (l->pos && l->pos == l->len && (colpos2 + pcollen) % l->cols == 0) {
            ab.append("\n");
            snprintf(seq,64,"\r");
            ab.append(seq);
            rows++;
            if (rows > (int)l->oldrows) l->oldrows = rows;
        }

        /* Move cursor to right position. */
        rpos2 = (pcollen + colpos2 + l->cols) / l->cols; /* Current cursor relative row */

        /* Go up till we reach the expected position. */
        if (rows - rpos2 > 0) {
            snprintf(seq,64,"\x1b[%dA", rows-rpos2);
            ab.append(seq);
        }

        /* Set column. */
        col = (pcollen + colpos2) % l->cols;
        if (col)
            snprintf(seq,64,"\r\x1b[%dC", col);
        else
            snprintf(seq,64,"\r");
        ab.append(seq);
    }

    l->oldcolpos = colpos2;

    (void) !write(fd, ab.c_str(), ab.size()); /* Can't recover from write error. */
}